

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::Snapshot::ComputeRelativePathTopSource(Snapshot *this)

{
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  Snapshot *pSVar4;
  Snapshot snapshot;
  string result;
  string currentSource;
  allocator local_a9;
  void *local_a8;
  iterator iStack_a0;
  Snapshot *local_98;
  Snapshot local_88;
  undefined1 local_70 [32];
  string local_50;
  
  local_88.Position.Position = (this->Position).Position;
  local_88.State = this->State;
  local_88.Position.Tree = (this->Position).Tree;
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (Snapshot *)0x0;
  local_98 = (Snapshot *)0x0;
  std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
  _M_realloc_insert<cmState::Snapshot_const&>
            ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_a8,(iterator)0x0,
             &local_88);
  do {
    while( true ) {
      GetBuildsystemDirectoryParent((Snapshot *)local_70,&local_88);
      local_88.Position.Position = local_70._16_8_;
      local_88.State = (cmState *)local_70._0_8_;
      local_88.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_70._8_8_;
      bVar1 = IsValid(&local_88);
      if (!bVar1) {
        pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                           ((iterator *)((long)local_a8 + 8));
        pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&pSVar2->BuildSystemDirectory);
        std::__cxx11::string::string
                  ((string *)local_70,(pBVar3->Location)._M_dataplus._M_p,(allocator *)&local_50);
        pSVar4 = (Snapshot *)((long)local_a8 + 0x18);
        if (pSVar4 != iStack_a0._M_current) {
          do {
            pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                               (&pSVar4->Position);
            pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                               (&pSVar2->BuildSystemDirectory);
            std::__cxx11::string::string
                      ((string *)&local_50,(pBVar3->Location)._M_dataplus._M_p,&local_a9);
            bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_70,&local_50);
            if (bVar1) {
              std::__cxx11::string::_M_assign((string *)local_70);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            pSVar4 = pSVar4 + 1;
          } while (pSVar4 != iStack_a0._M_current);
        }
        pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
        pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&pSVar2->BuildSystemDirectory);
        std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopSource);
        if ((cmState *)local_70._0_8_ != (cmState *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
        if (local_a8 != (void *)0x0) {
          operator_delete(local_a8,(long)local_98 - (long)local_a8);
        }
        return;
      }
      if (iStack_a0._M_current != local_98) break;
      std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
      _M_realloc_insert<cmState::Snapshot_const&>
                ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_a8,iStack_a0,
                 &local_88);
    }
    ((iStack_a0._M_current)->Position).Position = local_88.Position.Position;
    *(undefined4 *)&(iStack_a0._M_current)->State = local_88.State._0_4_;
    *(undefined4 *)((long)&(iStack_a0._M_current)->State + 4) = local_88.State._4_4_;
    *(undefined4 *)&((iStack_a0._M_current)->Position).Tree = local_88.Position.Tree._0_4_;
    *(undefined4 *)((long)&((iStack_a0._M_current)->Position).Tree + 4) =
         local_88.Position.Tree._4_4_;
    iStack_a0._M_current = iStack_a0._M_current + 1;
  } while( true );
}

Assistant:

void cmState::Snapshot::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmState::Snapshot snapshot = *this;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result = snapshots.front().GetCurrentSourceDirectory();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentSource = it->GetCurrentSourceDirectory();
    if(cmSystemTools::IsSubDirectory(result, currentSource))
      {
      result = currentSource;
      }
    }
  this->Position->BuildSystemDirectory->RelativePathTopSource = result;
}